

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execBitFieldDn<(moira::Core)2,(moira::Instr)138,(moira::Mode)0,4>
          (Moira *this,u16 opcode)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  u32 uVar5;
  uint uVar6;
  uint uVar7;
  char cVar8;
  
  this->cp = 0;
  uVar1 = (this->queue).irc;
  cVar8 = (char)uVar1;
  uVar5 = (this->reg).pc + 2;
  (this->reg).pc = uVar5;
  uVar5 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar5);
  (this->queue).irc = (u16)uVar5;
  this->readBuffer = (u16)uVar5;
  if ((uVar1 >> 0xb & 1) == 0) {
    uVar3 = uVar1 >> 6 & 0x1f;
  }
  else {
    uVar3 = *(uint *)((long)&(this->reg).field_3 + (ulong)(uVar1 >> 6 & 7) * 4);
  }
  if ((uVar1 & 0x20) != 0) {
    cVar8 = (char)*(undefined4 *)((long)&(this->reg).field_3 + (ulong)(uVar1 & 7) * 4);
  }
  uVar6 = *(uint *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4);
  bVar2 = (byte)uVar3 & 0x1f;
  uVar6 = uVar6 << bVar2 | uVar6 >> 0x20 - bVar2;
  bVar4 = cVar8 - 1U & 0x1f;
  (this->reg).sr.n = SUB41(uVar6 >> 0x1f,0);
  bVar2 = ~bVar4 & 0x1f;
  (this->reg).sr.z = uVar6 >> bVar2 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  if (-1 < (int)uVar6) {
    uVar7 = 1 << bVar4;
    do {
      uVar3 = uVar3 + 1;
      if (uVar7 < 2) break;
      uVar7 = uVar7 >> 1;
    } while ((uVar7 & uVar6 >> bVar2) == 0);
  }
  *(uint *)((long)&(this->reg).field_3 + (ulong)(uVar1 >> 10 & 0x1c)) = uVar3;
  (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x12));
  uVar5 = (this->reg).pc;
  (this->reg).pc0 = uVar5;
  (this->queue).ird = (this->queue).irc;
  uVar5 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar5 + 2);
  (this->queue).irc = (u16)uVar5;
  this->readBuffer = (u16)uVar5;
  return;
}

Assistant:

void
Moira::execBitFieldDn(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    u16 ext = (u16)readI<C, Word>();

    int dy     = _____________xxx (opcode);
    int dn     = _xxx____________ (ext);
    int of     = _____xxxxx______ (ext);
    int doBit  = ____x___________ (ext);
    int wi     = ___________xxxxx (ext);
    int dwBit  = __________x_____ (ext);

    // If do or dw is set, offset or width are taken from data registers
    int rawOffset = doBit ? reg.d[of & 0b111] : of;
    int rawWidth = dwBit ? reg.d[wi & 0b111] : wi;

    // Crop offset and map width to 32, 1 ... 31
    int offset = rawOffset & 0b11111;
    int width = ((rawWidth - 1) & 0b11111) + 1;

    // Create the bit mask
    u32 mask = std::rotr(u32(0xFFFFFFFF00000000 >> width), offset);

    u32 data = readD(dy);
    u32 result, insert;

    switch (I) {

        case Instr::BFCHG:
        case Instr::BFCLR:
        case Instr::BFSET:

            result = bitfield<I>(data, offset, width, mask);
            writeD(dy, result);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0, 12)
            break;

        case Instr::BFEXTS:
        case Instr::BFEXTU:

            data = std::rotl(data, offset);
            result = bitfield<I>(data, offset, width, mask);
            writeD(dn, result);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0,  8)
            break;

        case Instr::BFFFO:
        {
            data = std::rotl(data, offset);
            result = bitfield<I>(data, rawOffset, width, mask);
            writeD(dn, result);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0, 18)
            break;
        }
        case Instr::BFINS:

            insert = readD(dn);
            insert = u32(insert << (32 - width));

            reg.sr.n = NBIT<S>(insert);
            reg.sr.z = ZERO<S>(insert);
            reg.sr.v = 0;
            reg.sr.c = 0;

            insert = std::rotr((u32)insert, offset);
            writeD(dy, (data & ~mask) | insert);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0, 10)
            break;

        case Instr::BFTST:

            (void)bitfield<I>(data, offset, width, mask);

            //           00  10  20        00  10  20        00  10  20
            //           .b  .b  .b        .w  .w  .w        .l  .l  .l
            CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0,  6)
            break;

        default:
            fatalError;
    }

    prefetch<C, POLL>();

    FINALIZE
}